

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_import_rsa_key(psa_key_type_t type,uint8_t *data,size_t data_length,mbedtls_rsa_context **p_rsa)

{
  int iVar1;
  mbedtls_pk_type_t mVar2;
  size_t sVar3;
  size_t bits;
  mbedtls_rsa_context *rsa;
  mbedtls_pk_context pk;
  psa_status_t status;
  mbedtls_rsa_context **p_rsa_local;
  size_t data_length_local;
  uint8_t *data_local;
  psa_key_type_t type_local;
  
  mbedtls_pk_init((mbedtls_pk_context *)&rsa);
  if ((type & 0x7000) == 0x7000) {
    iVar1 = mbedtls_pk_parse_key((mbedtls_pk_context *)&rsa,data,data_length,(uchar *)0x0,0);
    pk.pk_ctx._4_4_ = mbedtls_to_psa_error(iVar1);
  }
  else {
    iVar1 = mbedtls_pk_parse_public_key((mbedtls_pk_context *)&rsa,data,data_length);
    pk.pk_ctx._4_4_ = mbedtls_to_psa_error(iVar1);
  }
  if (pk.pk_ctx._4_4_ == 0) {
    mVar2 = mbedtls_pk_get_type((mbedtls_pk_context *)&rsa);
    if (mVar2 == MBEDTLS_PK_RSA) {
      bits = (size_t)mbedtls_pk_rsa(_rsa);
      sVar3 = mbedtls_rsa_get_len((mbedtls_rsa_context *)bits);
      if (sVar3 << 3 < 0x1001) {
        pk.pk_ctx._4_4_ = psa_check_rsa_key_byte_aligned((mbedtls_rsa_context *)bits);
      }
      else {
        pk.pk_ctx._4_4_ = -0x86;
      }
    }
    else {
      pk.pk_ctx._4_4_ = -0x87;
    }
  }
  if (pk.pk_ctx._4_4_ == 0) {
    *p_rsa = (mbedtls_rsa_context *)bits;
    data_local._4_4_ = 0;
  }
  else {
    mbedtls_pk_free((mbedtls_pk_context *)&rsa);
    data_local._4_4_ = pk.pk_ctx._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static psa_status_t psa_import_rsa_key( psa_key_type_t type,
                                        const uint8_t *data,
                                        size_t data_length,
                                        mbedtls_rsa_context **p_rsa )
{
    psa_status_t status;
    mbedtls_pk_context pk;
    mbedtls_rsa_context *rsa;
    size_t bits;

    mbedtls_pk_init( &pk );

    /* Parse the data. */
    if( PSA_KEY_TYPE_IS_KEY_PAIR( type ) )
        status = mbedtls_to_psa_error(
            mbedtls_pk_parse_key( &pk, data, data_length, NULL, 0 ) );
    else
        status = mbedtls_to_psa_error(
            mbedtls_pk_parse_public_key( &pk, data, data_length ) );
    if( status != PSA_SUCCESS )
        goto exit;

    /* We have something that the pkparse module recognizes. If it is a
     * valid RSA key, store it. */
    if( mbedtls_pk_get_type( &pk ) != MBEDTLS_PK_RSA )
    {
        status = PSA_ERROR_INVALID_ARGUMENT;
        goto exit;
    }

    rsa = mbedtls_pk_rsa( pk );
    /* The size of an RSA key doesn't have to be a multiple of 8. Mbed TLS
     * supports non-byte-aligned key sizes, but not well. For example,
     * mbedtls_rsa_get_len() returns the key size in bytes, not in bits. */
    bits = PSA_BYTES_TO_BITS( mbedtls_rsa_get_len( rsa ) );
    if( bits > PSA_VENDOR_RSA_MAX_KEY_BITS )
    {
        status = PSA_ERROR_NOT_SUPPORTED;
        goto exit;
    }
    status = psa_check_rsa_key_byte_aligned( rsa );

exit:
    /* Free the content of the pk object only on error. */
    if( status != PSA_SUCCESS )
    {
        mbedtls_pk_free( &pk );
        return( status );
    }

    /* On success, store the content of the object in the RSA context. */
    *p_rsa = rsa;

    return( PSA_SUCCESS );
}